

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O2

void Aig_TableResize(Aig_Man_t *p)

{
  uint uVar1;
  Aig_Obj_t **__ptr;
  ulong uVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t **ppAVar4;
  uint uVar5;
  ulong uVar6;
  int iVar8;
  char *__assertion;
  ulong uVar9;
  Aig_Obj_t *pAVar10;
  Aig_Obj_t *pObj;
  timespec local_40;
  ulong uVar7;
  
  if (p->pTable != (Aig_Obj_t **)0x0) {
    clock_gettime(3,&local_40);
    __ptr = p->pTable;
    uVar1 = p->nTableSize;
    uVar6 = (ulong)((p->nObjs[6] + p->nObjs[5]) * 2 - 1);
    do {
      do {
        uVar5 = (int)uVar6 + 1;
        uVar7 = (ulong)uVar5;
        uVar9 = uVar6 & 1;
        uVar6 = uVar7;
      } while (uVar9 != 0);
      uVar9 = 3;
      do {
        iVar8 = (int)uVar9;
        if (uVar5 < (uint)(iVar8 * iVar8)) {
          p->nTableSize = uVar5;
          ppAVar4 = (Aig_Obj_t **)calloc(1,(long)(int)uVar5 << 3);
          p->pTable = ppAVar4;
          uVar9 = 0;
          uVar6 = (ulong)uVar1;
          if ((int)uVar1 < 1) {
            uVar6 = uVar9;
          }
          iVar8 = 0;
          goto LAB_0050bcea;
        }
        uVar2 = uVar7 % uVar9;
        uVar9 = (ulong)(iVar8 + 2);
      } while ((int)uVar2 != 0);
    } while( true );
  }
  __assertion = "p->pTable != NULL";
  uVar1 = 0x4b;
LAB_0050bd79:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                ,uVar1,"void Aig_TableResize(Aig_Man_t *)");
LAB_0050bcea:
  if (uVar9 == uVar6) goto LAB_0050bd3a;
  pAVar10 = __ptr[uVar9];
  if (pAVar10 != (Aig_Obj_t *)0x0) goto LAB_0050bd30;
  pAVar3 = (Aig_Obj_t *)0x0;
  pObj = pAVar10;
  while (pAVar10 = pAVar3, pObj != (Aig_Obj_t *)0x0) {
    ppAVar4 = Aig_TableFind(p,pObj);
    if (*ppAVar4 != (Aig_Obj_t *)0x0) {
      __assertion = "*ppPlace == NULL";
      uVar1 = 0x5c;
      goto LAB_0050bd79;
    }
    *ppAVar4 = pObj;
    (pObj->field_0).pNext = (Aig_Obj_t *)0x0;
    iVar8 = iVar8 + 1;
    pAVar3 = (Aig_Obj_t *)0x0;
    pObj = pAVar10;
    if (pAVar10 != (Aig_Obj_t *)0x0) {
LAB_0050bd30:
      pAVar3 = (pAVar10->field_0).pNext;
      pObj = pAVar10;
    }
  }
  uVar9 = uVar9 + 1;
  goto LAB_0050bcea;
LAB_0050bd3a:
  if (iVar8 == p->nObjs[6] + p->nObjs[5]) {
    free(__ptr);
    return;
  }
  __assertion = "Counter == Aig_ManNodeNum(p)";
  uVar1 = 0x62;
  goto LAB_0050bd79;
}

Assistant:

void Aig_TableResize( Aig_Man_t * p )
{
    Aig_Obj_t * pEntry, * pNext;
    Aig_Obj_t ** pTableOld, ** ppPlace;
    int nTableSizeOld, Counter, i;
    abctime clk;
    assert( p->pTable != NULL );
clk = Abc_Clock();
    // save the old table
    pTableOld = p->pTable;
    nTableSizeOld = p->nTableSize;
    // get the new table
    p->nTableSize = Abc_PrimeCudd( 2 * Aig_ManNodeNum(p) ); 
    p->pTable = ABC_ALLOC( Aig_Obj_t *, p->nTableSize );
    memset( p->pTable, 0, sizeof(Aig_Obj_t *) * p->nTableSize );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < nTableSizeOld; i++ )
    for ( pEntry = pTableOld[i], pNext = pEntry? pEntry->pNext : NULL; 
          pEntry; pEntry = pNext, pNext = pEntry? pEntry->pNext : NULL )
    {
        // get the place where this entry goes in the table 
        ppPlace = Aig_TableFind( p, pEntry );
        assert( *ppPlace == NULL ); // should not be there
        // add the entry to the list
        *ppPlace = pEntry;
        pEntry->pNext = NULL;
        Counter++;
    }
    assert( Counter == Aig_ManNodeNum(p) );
//    printf( "Increasing the structural table size from %6d to %6d. ", nTableSizeOld, p->nTableSize );
//    ABC_PRT( "Time", Abc_Clock() - clk );
    // replace the table and the parameters
    ABC_FREE( pTableOld );
}